

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall
asmjit::Assembler::_emitLog
          (Assembler *this,uint32_t instId,uint32_t options,Operand_ *o0,Operand_ *o1,Operand_ *o2,
          Operand_ *o3,uint32_t relSize,uint32_t imLen,uint8_t *afterCursor)

{
  uint uVar1;
  undefined8 *in_RCX;
  uint in_EDX;
  undefined4 in_ESI;
  Detail *in_RDI;
  long in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  Operand_ opArray [6];
  intptr_t emittedSize;
  uint8_t *beforeCursor;
  uint32_t logOptions;
  StringBuilderTmp<256UL> sb;
  Logger *logger;
  undefined4 in_stack_fffffffffffffc4c;
  undefined4 local_3a8;
  size_t in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  uint32_t in_stack_fffffffffffffc74;
  StringBuilder *in_stack_fffffffffffffc78;
  undefined8 local_378;
  undefined8 local_370;
  char *comment;
  size_t imLen_00;
  RegOnly dispLen;
  size_t binLen;
  RegOnly binData;
  StringBuilder *sb_00;
  undefined1 *local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined1 local_300 [264];
  long *local_1f8;
  undefined8 *local_1f0;
  long local_1e8;
  undefined8 *local_1e0;
  uint local_1d8;
  undefined4 local_1d4;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  RegOnly local_1b8;
  undefined8 local_1b0;
  undefined1 *local_1a8;
  long *local_1a0;
  undefined1 **local_198;
  undefined1 **local_180;
  undefined1 **local_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined1 **local_158;
  long *local_150;
  RegOnly *local_148;
  undefined1 *local_140;
  RegOnly *local_138;
  undefined1 *local_130;
  undefined1 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  long local_108;
  undefined1 *local_100;
  undefined8 *local_f8;
  undefined1 *local_f0;
  Detail *local_e0;
  uint local_d8;
  undefined4 local_d4;
  undefined4 *local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined1 *local_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined1 *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined1 *local_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined1 *local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined1 *local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined1 *local_70;
  undefined4 local_68;
  undefined4 local_64;
  undefined1 *local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined1 *local_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  RegOnly *local_20;
  RegOnly *local_18;
  undefined1 *local_10;
  undefined1 **local_8;
  
  local_1b8 = in_RDI[1].extraReg;
  local_1f8 = *(long **)((long)local_1b8 + 0x28);
  if (local_1f8 == (long *)0x0) {
    DebugUtils::assertionFailed
              ((char *)opArray[3].field_0._0_8_,opArray[2].field_0._any.reserved12_4,
               (char *)opArray[2].field_0._0_8_);
  }
  if ((in_EDX & 4) == 0) {
    DebugUtils::assertionFailed
              ((char *)opArray[3].field_0._0_8_,opArray[2].field_0._any.reserved12_4,
               (char *)opArray[2].field_0._0_8_);
  }
  local_198 = &local_320;
  local_10 = &NoInit;
  local_320 = local_300;
  local_300[0] = 0;
  local_318 = 0;
  local_310 = 0x100;
  local_308 = 0;
  uVar1 = *(uint *)(local_1f8 + 1);
  local_160 = (long)local_1f8 + 0xc;
  local_158 = &local_320;
  local_168 = 0xffffffffffffffff;
  local_1f0 = in_R9;
  local_1e8 = in_R8;
  local_1e0 = in_RCX;
  local_1d8 = in_EDX;
  local_1d4 = in_ESI;
  local_170 = local_1f8;
  local_150 = local_1f8;
  local_8 = local_198;
  StringBuilder::_opString
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc74,
             (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc60);
  local_f0 = &stack0xfffffffffffffc68;
  local_f8 = local_1e0;
  local_100 = &stack0xfffffffffffffc78;
  local_108 = local_1e8;
  local_110 = &local_378;
  local_118 = local_1f0;
  local_378 = *local_1f0;
  local_370 = local_1f0[1];
  local_120 = &stack0xfffffffffffffc98;
  comment = (char *)*in_stack_00000008;
  imLen_00 = in_stack_00000008[1];
  if ((local_1d8 & 8) == 0) {
    local_1c0 = &stack0xfffffffffffffca8;
    local_c4 = 0;
    local_c8 = 0;
    local_54 = 0;
    local_58 = 0;
    local_44 = 0;
    local_48 = 0;
    dispLen._signature = 0;
    dispLen._id = 0;
    local_a4 = 0;
    local_a8 = 0;
    local_70 = &stack0xfffffffffffffcb0;
    local_74 = 0;
    local_78 = 0;
    local_34 = 0;
    local_38 = 0;
    binLen = 0;
    local_1c8 = &stack0xfffffffffffffcb8;
    local_b4 = 0;
    local_b8 = 0;
    local_64 = 0;
    local_68 = 0;
    local_3c = 0;
    local_40 = 0;
    binData._signature = 0;
    binData._id = 0;
    local_94 = 0;
    local_98 = 0;
    local_80 = &stack0xfffffffffffffcc0;
    local_84 = 0;
    local_88 = 0;
    local_2c = 0;
    local_30 = 0;
    sb_00 = (StringBuilder *)0x0;
    local_c0 = local_1c0;
    local_b0 = local_1c8;
    local_a0 = local_1c0;
    local_90 = local_1c8;
    local_60 = local_1c8;
    local_50 = local_1c0;
  }
  else {
    local_130 = &stack0xfffffffffffffca8;
    local_138 = &in_RDI[9].extraReg;
    dispLen = *local_138;
    binLen._0_4_ = in_RDI[10].instId;
    binLen._4_4_ = in_RDI[10].options;
    local_140 = &stack0xfffffffffffffcb8;
    local_148 = &in_RDI[10].extraReg;
    binData = *local_148;
    sb_00 = *(StringBuilder **)(in_RDI + 0xb);
  }
  local_20 = &in_RDI->extraReg;
  local_e0 = in_RDI + 4;
  local_d0 = &local_3a8;
  local_d4 = local_1d4;
  local_d8 = local_1d8;
  local_3a8 = local_1d4;
  local_18 = local_20;
  Logging::formatInstruction
            ((StringBuilder *)local_1e0[1],(uint32_t)((ulong)*local_1e0 >> 0x20),
             *(CodeEmitter **)local_e0,local_1d8,in_RDI,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffc4c,6),
             (uint32_t)*(undefined8 *)(local_1e8 + 8));
  if ((uVar1 & 1) == 0) {
    Logging::formatLine(sb_00,(uint8_t *)binData,binLen,(size_t)dispLen,imLen_00,comment);
  }
  else {
    Logging::formatLine(sb_00,(uint8_t *)binData,binLen,(size_t)dispLen,imLen_00,comment);
  }
  local_180 = &local_320;
  local_1a8 = local_320;
  local_178 = &local_320;
  local_1b0 = local_318;
  local_1a0 = local_1f8;
  (**(code **)(*local_1f8 + 0x10))(local_1f8,local_320,local_318);
  StringBuilderTmp<256UL>::~StringBuilderTmp((StringBuilderTmp<256UL> *)0x1dea5b);
  return;
}

Assistant:

void Assembler::_emitLog(
  uint32_t instId, uint32_t options, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3,
  uint32_t relSize, uint32_t imLen, uint8_t* afterCursor) {

  Logger* logger = _code->getLogger();
  ASMJIT_ASSERT(logger != nullptr);
  ASMJIT_ASSERT(options & CodeEmitter::kOptionLoggingEnabled);

  StringBuilderTmp<256> sb;
  uint32_t logOptions = logger->getOptions();

  uint8_t* beforeCursor = _bufferPtr;
  intptr_t emittedSize = (intptr_t)(afterCursor - beforeCursor);

  sb.appendString(logger->getIndentation());

  Operand_ opArray[6];
  opArray[0].copyFrom(o0);
  opArray[1].copyFrom(o1);
  opArray[2].copyFrom(o2);
  opArray[3].copyFrom(o3);

  if (options & kOptionOp4Op5Used) {
    opArray[4].copyFrom(_op4);
    opArray[5].copyFrom(_op5);
  }
  else {
    opArray[4].reset();
    opArray[5].reset();
  }

  Logging::formatInstruction(
    sb, logOptions,
    this, getArchType(),
    Inst::Detail(instId, options, _extraReg), opArray, 6);

  if ((logOptions & Logger::kOptionBinaryForm) != 0)
    Logging::formatLine(sb, _bufferPtr, emittedSize, relSize, imLen, getInlineComment());
  else
    Logging::formatLine(sb, nullptr, Globals::kInvalidIndex, 0, 0, getInlineComment());

  logger->log(sb.getData(), sb.getLength());
}